

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableExtensionLiteGenerator::ImmutableExtensionLiteGenerator
          (ImmutableExtensionLiteGenerator *this,FieldDescriptor *descriptor,Context *context)

{
  FieldDescriptor *pFVar1;
  ClassNameResolver *this_00;
  string local_50;
  LogMessageFatal local_30;
  
  (this->super_ExtensionGenerator)._vptr_ExtensionGenerator =
       (_func_int **)&PTR__ImmutableExtensionLiteGenerator_01971118;
  this->descriptor_ = descriptor;
  this_00 = Context::GetNameResolver(context);
  this->name_resolver_ = this_00;
  (this->scope_)._M_dataplus._M_p = (pointer)&(this->scope_).field_2;
  (this->scope_)._M_string_length = 0;
  (this->scope_).field_2._M_local_buf[0] = '\0';
  this->context_ = context;
  pFVar1 = this->descriptor_;
  if ((pFVar1->field_0x1 & 8) == 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
               ,0xb3d,"is_extension_");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_50);
  }
  if ((pFVar1->scope_).extension_scope == (Descriptor *)0x0) {
    ClassNameResolver::GetClassName_abi_cxx11_(&local_50,this_00,pFVar1->file_,true);
  }
  else {
    if ((pFVar1->field_0x1 & 8) == 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                (&local_30,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb3d,"is_extension_");
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_30);
    }
    ClassNameResolver::GetClassName_abi_cxx11_
              (&local_50,this_00,(pFVar1->scope_).extension_scope,true);
  }
  std::__cxx11::string::operator=((string *)&this->scope_,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

ImmutableExtensionLiteGenerator::ImmutableExtensionLiteGenerator(
    const FieldDescriptor* descriptor, Context* context)
    : descriptor_(descriptor),
      name_resolver_(context->GetNameResolver()),
      context_(context) {
  if (descriptor_->extension_scope() != nullptr) {
    scope_ =
        name_resolver_->GetImmutableClassName(descriptor_->extension_scope());
  } else {
    scope_ = name_resolver_->GetImmutableClassName(descriptor_->file());
  }
}